

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O3

uint8_t * __thiscall DTSStreamReader::findFrame(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  byte bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t *p_buf;
  ulong uVar5;
  uint8_t *puVar6;
  uint64_t local_38;
  
  uVar4 = (long)end - (long)buff;
  if (0xf < (long)uVar4) {
    while( true ) {
      local_38 = *(uint64_t *)buff;
      uVar2 = my_ntohll(&local_38);
      local_38 = *(uint64_t *)((long)buff + 8);
      uVar3 = my_ntohll(&local_38);
      uVar5 = uVar3 + 0x10;
      if (0x2000000000000000 < uVar5) break;
      if ((long)uVar2 < 0x434f524553534d44) {
        if (0x424c41434b4f5553 < (long)uVar2) {
          if ((uVar2 != 0x424c41434b4f5554) && (uVar2 != 0x4252414e43485054)) {
            uVar3 = 0x4255494c44564552;
            goto LAB_00182688;
          }
          goto LAB_0018268d;
        }
        if (uVar2 != 0x415550522d484452) {
          if (uVar2 != 0x41555052494e464f) {
            uVar3 = 0x4249545348565442;
            goto LAB_00182688;
          }
          goto LAB_0018268d;
        }
        if (end < (byte *)(uVar5 + (long)buff)) {
          return (uint8_t *)0x0;
        }
        this->m_skippingSamples =
             (uint)(ushort)(*(ushort *)((long)buff + 0x23) << 8 |
                           *(ushort *)((long)buff + 0x23) >> 8);
      }
      else {
        if ((long)uVar2 < 0x46494c45494e464f) {
          if ((uVar2 != 0x434f524553534d44) && (uVar2 != 0x4454534844484452)) {
            uVar3 = 0x45585453535f4d44;
LAB_00182688:
            if (uVar2 != uVar3) break;
          }
        }
        else if ((long)uVar2 < 0x5354524d44415441) {
          if (uVar2 != 0x46494c45494e464f) {
            uVar3 = 0x4e4156492d54424c;
            goto LAB_00182688;
          }
        }
        else if (uVar2 != 0x54494d45434f4445) {
          if (uVar2 == 0x5354524d44415441) {
            buff = (uint8_t *)((long)buff + 0x10);
          }
          break;
        }
LAB_0018268d:
        if (uVar4 < uVar5) {
          return (uint8_t *)0x0;
        }
      }
      buff = (uint8_t *)(uVar5 + (long)buff);
      uVar4 = (long)end - (long)buff;
      if ((long)uVar4 < 0x10) break;
    }
  }
  if (this->m_firstCall == true) {
    this->m_firstCall = false;
    checkIfOnlyHDDataExists(this,buff,end);
  }
  if (this->m_isCoreExists == false) {
    if (buff < end + -4) {
      puVar6 = end + (-4 - (long)buff);
      do {
        if (((((byte)*(uint64_t *)buff == 100) && (*(byte *)((long)buff + 1) == 0x58)) &&
            (*(byte *)((long)buff + 2) == 0x20)) && (*(byte *)((long)buff + 3) == 0x25)) {
          return (uint8_t *)(uint64_t *)buff;
        }
        buff = (uint8_t *)((long)buff + 1);
        puVar6 = puVar6 + -1;
      } while (puVar6 != (uint8_t *)0x0);
    }
  }
  else if (buff < end + -4) {
    puVar6 = end + (-4 - (long)buff);
    do {
      bVar1 = (byte)*(uint64_t *)buff;
      if (buff < end + -6) {
        if (bVar1 < 0xfe) {
          if (((((bVar1 == 0x1f) && (*(byte *)((long)buff + 1) == 0xff)) &&
               (*(byte *)((long)buff + 2) == 0xe8)) &&
              ((*(byte *)((long)buff + 3) == 0 && (*(byte *)((long)buff + 4) == 7)))) &&
             (0xef < *(byte *)((long)buff + 5))) {
            return (uint8_t *)(uint64_t *)buff;
          }
        }
        else if ((((bVar1 != 0xfe) && (bVar1 == 0xff)) &&
                 ((*(byte *)((long)buff + 1) == 0x1f &&
                  ((*(byte *)((long)buff + 2) == 0 && (*(byte *)((long)buff + 3) == 0xe8)))))) &&
                ((0xef < *(byte *)((long)buff + 4) && (*(byte *)((long)buff + 5) == 7)))) {
          return (uint8_t *)(uint64_t *)buff;
        }
      }
      buff = (uint8_t *)((long)buff + 1);
      puVar6 = puVar6 + -1;
    } while (puVar6 != (uint8_t *)0x0);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* DTSStreamReader::findFrame(uint8_t* buff, uint8_t* end)
{
    // check for DTS-HD headers
    while (end - buff >= 16)
    {
        const auto ptr = reinterpret_cast<int64_t*>(buff);
        const uint64_t hdrType = my_ntohll(ptr[0]);
        const uint64_t hdrSize = my_ntohll(ptr[1]) + 16;

        if (hdrSize > static_cast<uint64_t>(1) << 61)
            break;

        if (hdrType == AUPRINFO || hdrType == BITSHVTB || hdrType == BLACKOUT || hdrType == BRANCHPT ||
            hdrType == BUILDVER || hdrType == CORESSMD || hdrType == EXTSS_MD || hdrType == FILEINFO ||
            hdrType == NAVI_TBL || hdrType == TIMECODE || hdrType == DTSHDHDR)
        {
            if (hdrSize > static_cast<size_t>(end - buff))
                return nullptr;  // need more data
            buff += hdrSize;
        }
        else if (hdrType == AUPR_HDR)
        {
            if (buff + hdrSize > end)
                return nullptr;  // need more data
            // determine skipping frames amount
            m_skippingSamples = (buff[35] << 8) + buff[36];
            buff += hdrSize;
        }
        else if (hdrType == STRMDATA)
        {
            // m_dataSegmentLen = hdrSize;
            buff += 16;
            break;
        }
        else
        {
            break;  // no more HD headers
        }
    }

    if (m_firstCall)
    {
        m_firstCall = false;
        checkIfOnlyHDDataExists(buff, end);
    }

    if (!m_isCoreExists)
    {
        // if not core exists find HD frames directly
        for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
        {
            if (p_buf[0] == 0x64 && p_buf[1] == 0x58 && p_buf[2] == 0x20 && p_buf[3] == 0x25)
            {
                return p_buf;
            }
        }
        return nullptr;
    }

    for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
    {
        if (p_buf < end - 6)
        {
            if (p_buf[0] == 0xff && p_buf[1] == 0x1f && p_buf[2] == 0x00 && p_buf[3] == 0xe8 &&
                (p_buf[4] & 0xf0) == 0xf0 && p_buf[5] == 0x07)
            {
                return p_buf;
            }
            // 14 bits, big endian version of the bitstream
            if (p_buf[0] == 0x1f && p_buf[1] == 0xff && p_buf[2] == 0xe8 && p_buf[3] == 0x00 && p_buf[4] == 0x07 &&
                (p_buf[5] & 0xf0) == 0xf0)
            {
                return p_buf;
            }
        }
        // 16 bits, big endian version of the bitstream
        if (p_buf[0] == 0x7f && p_buf[1] == 0xfe && p_buf[2] == 0x80 && p_buf[3] == 0x01)
        {
            return p_buf;
        }
        // 16 bits, little endian version of the bitstream
        if (p_buf[0] == 0xfe && p_buf[1] == 0x7f && p_buf[2] == 0x01 && p_buf[3] == 0x80)
        {
            return p_buf;
        }
    }
    return nullptr;
}